

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void sprintf<int,int>(stringstream *oss,string *fmt,int value,int args)

{
  ostream *this;
  char cVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  int value_00;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  runtime_error *this_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  size_t afterpos;
  int local_58;
  int local_54;
  string local_50;
  
  this = (ostream *)(oss + 0x10);
  uVar8 = 0;
  local_54 = value;
  while( true ) {
    if (fmt->_M_string_length <= uVar8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"extra arguments provided to sprintf");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = (fmt->_M_dataplus)._M_p;
    cVar1 = pcVar2[uVar8];
    uVar9 = uVar8;
    if ((cVar1 == '%') && (uVar9 = uVar8 + 1, pcVar2[uVar8 + 1] != '%')) break;
    std::operator<<(this,cVar1);
    uVar8 = uVar9 + 1;
  }
  local_58 = args;
  uVar7 = std::__cxx11::string::find_first_of((char *)fmt,0x124d27);
  uVar8 = uVar9;
  if (uVar9 < uVar7) {
    uVar8 = uVar7;
  }
  bVar4 = false;
  for (; uVar10 = uVar8, uVar9 < uVar7; uVar9 = uVar9 + 1) {
    cVar1 = (fmt->_M_dataplus)._M_p[uVar9];
    if (cVar1 != ' ') {
      if (cVar1 == '0') {
        if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
          std::operator<<(this,0x30);
        }
      }
      else if (cVar1 == '+') {
        *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
             *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
      }
      else if (cVar1 == '-') {
        *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
             *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
      }
      else {
        uVar10 = uVar9;
        if (cVar1 != '#') break;
        bVar4 = true;
      }
    }
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)fmt);
  iVar6 = std::__cxx11::stoi(&local_50,&afterpos,10);
  std::__cxx11::string::~string((string *)&local_50);
  value_00 = local_58;
  *(long *)(oss + *(long *)(*(long *)this + -0x18) + 0x20) = (long)iVar6;
  lVar11 = uVar10 + afterpos;
  bVar5 = (fmt->_M_dataplus)._M_p[lVar11];
  if (bVar5 == 0x2e) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)fmt);
    iVar6 = std::__cxx11::stoi(&local_50,&afterpos,10);
    std::__cxx11::string::~string((string *)&local_50);
    *(long *)(oss + *(long *)(*(long *)this + -0x18) + 0x18) = (long)iVar6;
    bVar5 = (fmt->_M_dataplus)._M_p[lVar11 + 1 + afterpos];
  }
  if ((bVar5 | 0x20) == 0x78) {
    lVar11 = *(long *)this;
    lVar3 = *(long *)(lVar11 + -0x18);
    *(uint *)(oss + lVar3 + 0x28) = *(uint *)(oss + lVar3 + 0x28) & 0xffffffb5 | 8;
    if (bVar4) {
      *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(lVar11 + -0x18) + 0x28) | 0x200;
    }
  }
  std::ostream::operator<<(this,local_54);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)fmt);
  sprintf<int>(oss,&local_50,value_00);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}